

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::EndGroup(XmlReporter *this,string *param_1,Totals *totals)

{
  allocator local_83;
  allocator local_82;
  allocator local_81;
  undefined1 local_80 [8];
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"OverallResults",&local_81);
  XmlWriter::scopedElement((XmlWriter *)local_80,(string *)&this->m_xml);
  std::__cxx11::string::string((string *)&local_58,"successes",&local_82);
  XmlWriter::writeAttribute<unsigned_long>((XmlWriter *)local_80,&local_58,(unsigned_long *)totals);
  std::__cxx11::string::string((string *)(local_80 + 8),"failures",&local_83);
  XmlWriter::writeAttribute<unsigned_long>
            ((XmlWriter *)local_80,(string *)(local_80 + 8),&(totals->assertions).failed);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
  std::__cxx11::string::~string(local_38);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void EndGroup( const std::string&, const Totals& totals ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", totals.assertions.passed )
                .writeAttribute( "failures", totals.assertions.failed );
            m_xml.endElement();
        }